

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O2

int nva_init(void)

{
  int iVar1;
  long lVar2;
  nva_card *pnVar3;
  pci_device *ppVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  iVar1 = pci_system_init();
  uVar7 = 0xffffffff;
  if (iVar1 == 0) {
    nva_vgaarberr = pci_device_vgaarb_init();
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      for (uVar8 = 0; uVar8 < nva_types[lVar6].len; uVar8 = uVar8 + 1) {
        lVar2 = pci_id_match_iterator_create(nva_types[lVar6].match + uVar8);
        if (lVar2 == 0) {
          pci_system_cleanup();
          return -1;
        }
        while (ppVar4 = (pci_device *)pci_device_next(lVar2), ppVar4 != (pci_device *)0x0) {
          iVar1 = pci_device_probe(ppVar4);
          if (iVar1 == 0) {
            pci_device_enable(ppVar4);
            pnVar3 = (*nva_types[lVar6].func)(ppVar4);
            if (pnVar3 != (nva_card *)0x0) {
              if (nva_cardsmax <= nva_cardsnum) {
                bVar9 = nva_cardsmax == 0;
                nva_cardsmax = nva_cardsmax * 2;
                if (bVar9) {
                  nva_cardsmax = 0x10;
                }
                nva_cards = (nva_card **)realloc(nva_cards,(long)nva_cardsmax << 3);
              }
              lVar5 = (long)nva_cardsnum;
              nva_cardsnum = nva_cardsnum + 1;
              nva_cards[lVar5] = pnVar3;
            }
          }
          else {
            fprintf(_stderr,"WARN: Can\'t probe %04x:%02x:%02x.%x\n",(ulong)ppVar4->domain,
                    (ulong)ppVar4->bus,(ulong)ppVar4->dev,(ulong)ppVar4->func);
          }
        }
        pci_iterator_destroy(lVar2);
      }
    }
    pnVar3 = nva_init_platform();
    iVar1 = nva_cardsnum;
    if (pnVar3 != (nva_card *)0x0) {
      if (nva_cardsmax <= nva_cardsnum) {
        iVar1 = nva_cardsmax * 2;
        if (nva_cardsmax == 0) {
          iVar1 = 0x10;
        }
        nva_cardsmax = iVar1;
        nva_cards = (nva_card **)realloc(nva_cards,(long)iVar1 << 3);
      }
      lVar6 = (long)nva_cardsnum;
      iVar1 = nva_cardsnum + 1;
      nva_cardsnum = iVar1;
      nva_cards[lVar6] = pnVar3;
    }
    uVar7 = (uint)(iVar1 == 0);
  }
  return uVar7;
}

Assistant:

int nva_init() {
	int ret;
	ret = pci_system_init();
	if (ret)
		return -1;
	nva_vgaarberr = pci_device_vgaarb_init();
	int i, j;

	for (i = 0; i < ARRAY_SIZE(nva_types); i++) {
		for (j = 0; j < nva_types[i].len; j++) {
			struct pci_device_iterator* it = pci_id_match_iterator_create(&nva_types[i].match[j]);
			if (!it) {
				pci_system_cleanup();
				return -1;
			}

			struct pci_device *dev;
			while ((dev = pci_device_next(it))) {
				ret = pci_device_probe(dev);
				if (ret) {
					fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
					continue;
				}
				pci_device_enable(dev);
				struct nva_card *card = nva_types[i].func(dev);
				if (card)
					ADDARRAY(nva_cards, card);
			}
			pci_iterator_destroy(it);
		}
	}

	/* Finally, try reading the platform */
	struct nva_card *card = nva_init_platform();
	if (card)
		ADDARRAY(nva_cards, card);

	return (nva_cardsnum == 0);
}